

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_relation.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::OrderRelation::GetQueryNode(OrderRelation *this)

{
  vector<duckdb::OrderByNode,_true> *this_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var2;
  _Alloc_hider _Var3;
  SelectNode *this_01;
  Relation *pRVar4;
  pointer pSVar5;
  StarExpression *this_02;
  pointer pOVar6;
  reference __args;
  reference pvVar7;
  reference pvVar8;
  pointer pPVar9;
  long in_RSI;
  size_type __n;
  templated_unique_single_t select;
  templated_unique_single_t order_node;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_70;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_68;
  string local_60;
  __uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> local_40;
  long local_38;
  
  local_40._M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
  .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
       (tuple<duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)this;
  this_01 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_01);
  local_68._M_head_impl = this_01;
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x80));
  (*pRVar4->_vptr_Relation[7])(&local_60,pRVar4);
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_68);
  _Var3._M_p = local_60._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)0x0;
  _Var1._M_head_impl =
       (pSVar5->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar5->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)_Var3._M_p;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
  }
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
  }
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_68);
  this_02 = (StarExpression *)operator_new(0x110);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  StarExpression::StarExpression(this_02,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_70._M_head_impl = (ParsedExpression *)this_02;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar5->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_70);
  if ((StarExpression *)local_70._M_head_impl != (StarExpression *)0x0) {
    (*((BaseExpression *)&((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
  local_60._M_dataplus._M_p = (pointer)operator_new(0x28);
  local_60._M_dataplus._M_p[8] = '\x02';
  *(undefined ***)local_60._M_dataplus._M_p = &PTR__OrderModifier_02474730;
  local_60._M_dataplus._M_p[0x10] = '\0';
  local_60._M_dataplus._M_p[0x11] = '\0';
  local_60._M_dataplus._M_p[0x12] = '\0';
  local_60._M_dataplus._M_p[0x13] = '\0';
  local_60._M_dataplus._M_p[0x14] = '\0';
  local_60._M_dataplus._M_p[0x15] = '\0';
  local_60._M_dataplus._M_p[0x16] = '\0';
  local_60._M_dataplus._M_p[0x17] = '\0';
  local_60._M_dataplus._M_p[0x18] = '\0';
  local_60._M_dataplus._M_p[0x19] = '\0';
  local_60._M_dataplus._M_p[0x1a] = '\0';
  local_60._M_dataplus._M_p[0x1b] = '\0';
  local_60._M_dataplus._M_p[0x1c] = '\0';
  local_60._M_dataplus._M_p[0x1d] = '\0';
  local_60._M_dataplus._M_p[0x1e] = '\0';
  local_60._M_dataplus._M_p[0x1f] = '\0';
  local_60._M_dataplus._M_p[0x20] = '\0';
  local_60._M_dataplus._M_p[0x21] = '\0';
  local_60._M_dataplus._M_p[0x22] = '\0';
  local_60._M_dataplus._M_p[0x23] = '\0';
  local_60._M_dataplus._M_p[0x24] = '\0';
  local_60._M_dataplus._M_p[0x25] = '\0';
  local_60._M_dataplus._M_p[0x26] = '\0';
  local_60._M_dataplus._M_p[0x27] = '\0';
  if (*(long *)(in_RSI + 0x70) != *(long *)(in_RSI + 0x68)) {
    this_00 = (vector<duckdb::OrderByNode,_true> *)(in_RSI + 0x68);
    __n = 0;
    local_38 = in_RSI;
    do {
      pOVar6 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
               operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                           *)&local_60);
      __args = vector<duckdb::OrderByNode,_true>::operator[](this_00,__n);
      pvVar7 = vector<duckdb::OrderByNode,_true>::operator[](this_00,__n);
      pvVar8 = vector<duckdb::OrderByNode,_true>::operator[](this_00,__n);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&pvVar8->expression);
      (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_70,pPVar9);
      ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pOVar6->orders,
                 &__args->type,&pvVar7->null_order,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_70);
      if ((StarExpression *)local_70._M_head_impl != (StarExpression *)0x0) {
        (*((BaseExpression *)&((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)(local_38 + 0x70) - *(long *)(local_38 + 0x68) >> 4));
  }
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_68);
  local_70._M_head_impl = (ParsedExpression *)local_60._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
              *)&(pSVar5->super_QueryNode).modifiers,
             (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)&local_70);
  if (local_70._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  _Var2._M_head_impl = local_68._M_head_impl;
  local_68._M_head_impl = (SelectNode *)0x0;
  *(SelectNode **)
   local_40._M_t.
   super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
   super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
  }
  if (local_68._M_head_impl != (SelectNode *)0x0) {
    (*((local_68._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
         local_40._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> OrderRelation::GetQueryNode() {
	auto select = make_uniq<SelectNode>();
	select->from_table = child->GetTableRef();
	select->select_list.push_back(make_uniq<StarExpression>());
	auto order_node = make_uniq<OrderModifier>();
	for (idx_t i = 0; i < orders.size(); i++) {
		order_node->orders.emplace_back(orders[i].type, orders[i].null_order, orders[i].expression->Copy());
	}
	select->modifiers.push_back(std::move(order_node));
	return std::move(select);
}